

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O0

void * __thiscall
bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::realloc
          (left_right_rep<Clasp::Literal,_unsigned_int> *this,void *__ptr,size_t __size)

{
  bool bVar1;
  size_type sVar2;
  int iVar3;
  buf_type *__dest;
  buf_type *__src;
  size_type r;
  buf_type *temp;
  size_type min_cap;
  size_type new_cap;
  left_right_rep<Clasp::Literal,_unsigned_int> *in_stack_ffffffffffffffc0;
  uint local_c;
  
  sVar2 = capacity(this);
  local_c = (sVar2 * 3 >> 1) << 2;
  if (local_c < 0x10) {
    local_c = 0x10;
  }
  __dest = (buf_type *)operator_new((ulong)local_c);
  iVar3 = (*(uint *)&this->field_0x8 & 0x7fffffff) - this->right_;
  bVar1 = empty(this);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 = (left_right_rep<Clasp::Literal,_unsigned_int> *)begin(this);
    sVar2 = left_size(this);
    memcpy(__dest,in_stack_ffffffffffffffc0,(ulong)sVar2 << 2);
    __src = right(this);
    sVar2 = right_size(this);
    memcpy(__dest + (local_c - iVar3),__src,(ulong)sVar2 << 2);
  }
  release(in_stack_ffffffffffffffc0);
  this->buf_ = __dest;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0x80000000 | local_c & 0x7fffffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0x7fffffff | 0x80000000;
  this->right_ = local_c - iVar3;
  return this;
}

Assistant:

void left_right_rep<L, R>::realloc() {
	size_type new_cap = ((capacity()*3)>>1) * block_size;
	size_type min_cap = 4 * block_size;
	if (new_cap < min_cap) new_cap = min_cap;
	buf_type* temp = (buf_type*)::operator new(new_cap*sizeof(buf_type));
	size_type r = cap_ - right_;
	if (!empty()) {
		// copy left
		std::memcpy(temp, begin(), left_size()*sizeof(L));
		// copy right
		std::memcpy(temp+(new_cap-r), right(), right_size() * sizeof(R));
	}
	// swap
	release();
	buf_   = temp;
	cap_   = new_cap;
	free_  = 1;
	right_ = new_cap - r;
}